

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

Index __thiscall
PlanningUnitMADPDiscrete::GetTimeStepForJAOHI(PlanningUnitMADPDiscrete *this,LIndex jaohI)

{
  bool bVar1;
  JointActionObservationHistoryTree *this_00;
  JointActionObservationHistory *this_01;
  size_t sVar2;
  undefined8 uVar3;
  ulong uVar4;
  const_reference pvVar5;
  ulong in_RSI;
  PlanningUnitMADPDiscrete *in_RDI;
  Index t;
  LIndex in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar6;
  Index local_4;
  
  bVar1 = PlanningUnitMADPDiscreteParameters::GetComputeJointActionObservationHistories
                    (&in_RDI->_m_params);
  if (bVar1) {
    this_00 = GetJointActionObservationHistoryTree(in_RDI,in_stack_ffffffffffffffc0);
    this_01 = TreeNode<JointActionObservationHistory>::GetContainedElement
                        (&this_00->super_TreeNode<JointActionObservationHistory>);
    sVar2 = History::GetLength((History *)this_01);
    local_4 = (Index)sVar2;
  }
  else {
    uVar6 = 0;
    sVar2 = PlanningUnit::GetHorizon(&in_RDI->super_PlanningUnit);
    if (sVar2 == 999999) {
      uVar3 = __cxa_allocate_exception(0x28);
      E::E((E *)CONCAT44(uVar6,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
      __cxa_throw(uVar3,&E::typeinfo,E::~E);
    }
    while( true ) {
      uVar4 = (ulong)uVar6;
      sVar2 = PlanningUnit::GetHorizon(&in_RDI->super_PlanningUnit);
      bVar1 = false;
      if (uVar4 < sVar2) {
        pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                           (&in_RDI->_m_firstJAOHIforT,(ulong)uVar6);
        bVar1 = *pvVar5 <= in_RSI;
      }
      if (!bVar1) break;
      uVar6 = uVar6 + 1;
    }
    PlanningUnit::GetHorizon(&in_RDI->super_PlanningUnit);
    local_4 = uVar6 - 1;
  }
  return local_4;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetTimeStepForJAOHI(LIndex jaohI) const
{
    // copied from GetTimeStepForJOHI
    if(_m_params.GetComputeJointActionObservationHistories())
        return(GetJointActionObservationHistoryTree(jaohI)->
               GetContainedElement()->GetLength() ); 
    else
    {
        Index t = 0;
        if(GetHorizon()==MAXHORIZON)
            throw(E("PlanningUnitMADPDiscrete::GetTimeStepForJAOHI does not work yet for infinite-horizon case"));

        while( t < GetHorizon() && _m_firstJAOHIforT[t] <= jaohI )
            t++;
        //  _m_firstJAOHIforT[t] > johI  OR t==GetHorizon
        if(t == GetHorizon())
            t--; //last time step is h-1
        else
            t--;//_m_nrJointActionObservationHistoriesT[t] > jaohI so
                //johI belongs to previous time step.
        return(t);
    }
}